

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g;
  
  g = L->l_G;
  g->gcemergency = (lu_byte)isemergency;
  if (g->gckind == '\0') {
    if (g->gcstate < 3) {
      entersweep(L);
    }
    luaC_runtilstate(L,0x100);
    luaC_runtilstate(L,0x80);
    luaC_runtilstate(L,0x100);
    setpause(g);
  }
  else {
    fullgen(L,g);
  }
  g->gcemergency = '\0';
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = isemergency;  /* set flag */
  if (g->gckind == KGC_INC)
    fullinc(L, g);
  else
    fullgen(L, g);
  g->gcemergency = 0;
}